

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment_common.cpp
# Opt level: O0

LCC_API_VIRTUALIZATION_DETAIL
license::os::find_in_map
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
           *map,string *data)

{
  bool bVar1;
  reference pvVar2;
  long lVar3;
  undefined1 local_60 [8];
  value_type it;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
  *__range2;
  string *data_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
  *map_local;
  
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
           ::begin(map);
  it._32_8_ = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
              ::end(map);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>,_true>
                         *)&it.second);
    if (!bVar1) {
      return BARE_TO_METAL;
    }
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>,_false,_true>
             ::operator*(&__end2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>
            *)local_60,pvVar2);
    lVar3 = std::__cxx11::string::find((string *)data,(ulong)local_60);
    if (lVar3 != -1) {
      map_local._4_4_ = it.first.field_2._8_4_;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>
             *)local_60);
    if (lVar3 != -1) break;
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>,_false,_true>
    ::operator++(&__end2);
  }
  return map_local._4_4_;
}

Assistant:

static LCC_API_VIRTUALIZATION_DETAIL find_in_map(const unordered_map<string, LCC_API_VIRTUALIZATION_DETAIL>& map,
												 const string& data) {
	for (auto it : map) {
		if (data.find(it.first) != string::npos) {
			return it.second;
		}
	}
	return BARE_TO_METAL;
}